

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmir_optimization.cpp
# Opt level: O0

bool __thiscall
front::optimization::bmir_optimization::BmirOptimization::should_run_pass
          (BmirOptimization *this,string *pass_name)

{
  bool bVar1;
  string *in_RSI;
  string pass;
  string *in_stack_ffffffffffffffd0;
  BmirOptimization *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,in_RSI);
  bVar1 = should_run_pass(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return bVar1;
}

Assistant:

bool BmirOptimization::should_run_pass(std::string&& pass_name) {
  auto pass = pass_name;
  return should_run_pass(pass);
}